

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void on_recv_data(connection *conn)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  ns_connection *pnVar4;
  byte *pbVar5;
  ns_connection *pnVar6;
  int iVar7;
  endpoint_type eVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  ulong uVar14;
  ssize_t sVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  byte *pbVar19;
  uint uVar20;
  uchar uVar21;
  byte bVar22;
  mg_connection *ri;
  uchar local_2e1;
  mg_connection *local_2e0;
  char b64_sha [40];
  char sha [20];
  SHA1_CTX local_288;
  char buf [500];
  
  pnVar4 = conn->ns_conn;
  if (conn->endpoint_type == EP_PROXY) {
    if ((conn->endpoint).nc == (ns_connection *)0x0) {
      return;
    }
    ns_forward(pnVar4,(conn->endpoint).nc);
    return;
  }
  try_parse(conn);
  if (conn->request_len < 0) {
LAB_0010abe8:
    iVar7 = 400;
LAB_0010ac04:
    send_http_error(conn,iVar7,(char *)0x0);
  }
  else if (conn->request_len == 0) {
LAB_0010abf2:
    if (0x4000 < (pnVar4->recv_iobuf).len) {
      iVar7 = 0x19d;
      goto LAB_0010ac04;
    }
  }
  else {
    pcVar11 = (conn->mg_conn).uri;
    if ((*pcVar11 == '/') ||
       (((*pcVar11 == '*' && (pcVar11[1] == '\0')) ||
        (iVar7 = mg_strncasecmp(pcVar11,"http",4), iVar7 == 0)))) {
LAB_0010abac:
      pcVar11 = (conn->mg_conn).http_version;
      iVar7 = strcmp(pcVar11,"1.0");
      if ((iVar7 != 0) && (iVar7 = strcmp(pcVar11,"1.1"), iVar7 != 0)) {
        iVar7 = 0x1f9;
        goto LAB_0010ac04;
      }
      eVar8 = conn->endpoint_type;
      if (eVar8 != EP_NONE) goto LAB_0010ac13;
      ri = &conn->mg_conn;
      pcVar11 = mg_get_header(ri,"Sec-WebSocket-Version");
      pcVar12 = mg_get_header(ri,"Sec-WebSocket-Key");
      if (pcVar12 != (char *)0x0 && pcVar11 != (char *)0x0) {
        (conn->mg_conn).is_websocket = 1;
        iVar7 = call_user(conn,MG_WS_HANDSHAKE);
        if (iVar7 == 0) {
          bVar22 = 0;
          mg_snprintf(buf,500,"%s%s",pcVar12,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11");
          local_288.state[0] = 0x67452301;
          local_288.state[1] = 0xefcdab89;
          local_288.state[2] = 0x98badcfe;
          local_288.state[3] = 0x10325476;
          local_288.state[4] = 0xc3d2e1f0;
          local_288.count[0] = 0;
          local_288.count[1] = 0;
          sVar13 = strlen(buf);
          SHA1Update(&local_288,(uchar *)buf,(uint32_t)sVar13);
          for (uVar14 = 0; uVar14 != 8; uVar14 = uVar14 + 1) {
            b64_sha[uVar14] = (char)(local_288.count[uVar14 < 4] >> (~bVar22 & 0x18));
            bVar22 = bVar22 + 8;
          }
          uVar21 = 0x80;
          local_2e0 = ri;
          do {
            local_2e1 = uVar21;
            SHA1Update(&local_288,&local_2e1,1);
            uVar21 = '\0';
            bVar22 = 0;
          } while ((local_288.count[0] & 0x1f8) != 0x1c0);
          SHA1Update(&local_288,(uchar *)b64_sha,8);
          ri = local_2e0;
          for (lVar16 = 0; lVar16 != 0x14; lVar16 = lVar16 + 1) {
            sha[lVar16] = (char)(*(uint *)((long)local_288.state +
                                          (ulong)((uint)lVar16 & 0xfffffffc)) >> (~bVar22 & 0x18));
            bVar22 = bVar22 + 8;
          }
          uVar14 = 0;
          for (uVar18 = 0; iVar7 = (int)uVar14, uVar18 < 0x14; uVar18 = uVar18 + 3) {
            uVar9 = 0;
            if (uVar18 == 0x13) {
              bVar22 = 0;
            }
            else {
              bVar22 = sha[uVar18 + 1];
              if (uVar18 < 0x12) {
                uVar9 = (uint)(byte)sha[uVar18 + 2];
              }
            }
            bVar2 = sha[uVar18];
            lVar16 = (long)iVar7;
            uVar14 = lVar16 + 2;
            b64_sha[lVar16] =
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar2 >> 2];
            b64_sha[lVar16 + 1] =
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(uint)(bVar22 >> 4) | (bVar2 & 3) << 4];
            if (uVar18 != 0x13) {
              b64_sha[lVar16 + 2] =
                   "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [(uVar9 >> 6) + (bVar22 & 0xf) * 4];
              uVar14 = lVar16 + 3U & 0xffffffff;
              if (uVar18 < 0x12) {
                b64_sha[lVar16 + 3] =
                     "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                     [uVar9 & 0x3f];
                uVar14 = (ulong)(iVar7 + 4);
              }
            }
            uVar14 = uVar14 & 0xffffffff;
          }
          uVar14 = (ulong)iVar7;
          lVar16 = uVar14 << 0x20;
          for (; (uVar14 & 3) != 0; uVar14 = uVar14 + 1) {
            b64_sha[uVar14] = '=';
            lVar16 = lVar16 + 0x100000000;
          }
          b64_sha[lVar16 >> 0x20] = '\0';
          mg_snprintf(buf,500,"%s%s%s",
                      "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: "
                      ,b64_sha,"\r\n\r\n");
          sVar13 = strlen(buf);
          mg_write(ri,buf,(int)sVar13);
        }
        call_user(conn,MG_WS_CONNECT);
      }
      pcVar11 = mg_get_header(ri,"Expect");
      if ((pcVar11 != (char *)0x0) && (iVar7 = mg_strcasecmp(pcVar11,"100-continue"), iVar7 == 0)) {
        ns_out(conn->ns_conn,"HTTP/1.1 100 Continue\r\n\r\n",0x19);
      }
      open_local_endpoint(conn,0);
    }
    else {
      iVar7 = __isoc99_sscanf(pcVar11,"%*[^ :]:%hu",buf);
      if (iVar7 < 1) goto LAB_0010abe8;
      if (conn->request_len == 0) goto LAB_0010abf2;
      if (0 < conn->request_len) goto LAB_0010abac;
    }
  }
  eVar8 = conn->endpoint_type;
LAB_0010ac13:
  if (eVar8 == EP_CGI) {
    if ((conn->endpoint).nc == (ns_connection *)0x0) {
      return;
    }
    ns_forward(conn->ns_conn,(conn->endpoint).nc);
    eVar8 = conn->endpoint_type;
  }
  if (eVar8 == EP_USER) {
    (conn->mg_conn).content = (pnVar4->recv_iobuf).buf;
    (conn->mg_conn).content_len = (pnVar4->recv_iobuf).len;
    uVar9 = call_user(conn,MG_RECV);
    if ((int)uVar9 < 0) {
      puVar1 = &conn->ns_conn->flags;
      *puVar1 = *puVar1 | 1;
    }
    else if ((ulong)uVar9 <= (pnVar4->recv_iobuf).len) {
      iobuf_remove(&pnVar4->recv_iobuf,(ulong)uVar9);
    }
    if ((conn->mg_conn).is_websocket == 0) {
      if ((long)conn->request_len + conn->cl <= conn->num_bytes_recv) {
        (conn->mg_conn).content = (conn->ns_conn->recv_iobuf).buf;
        iVar7 = call_user(conn,MG_REQUEST);
        if (iVar7 == 0) {
          open_local_endpoint(conn,1);
        }
        else if (iVar7 == 1) {
          if ((conn->ns_conn->flags & 0x100000) != 0) {
            write_terminating_chunk(conn);
          }
          close_local_endpoint(conn);
        }
      }
    }
    else {
      while( true ) {
        pbVar5 = (byte *)(conn->ns_conn->recv_iobuf).buf;
        uVar3 = (uint)(conn->ns_conn->recv_iobuf).len;
        uVar17 = 0;
        uVar9 = 0;
        uVar10 = 0;
        if (1 < (int)uVar3) {
          uVar10 = pbVar5[1] & 0x7f;
          uVar17 = pbVar5[1] >> 5 & 4;
          if (uVar3 < uVar17 || 0x7d < (byte)uVar10) {
            if (((byte)uVar10 == 0x7e) && (uVar9 = uVar17 + 4, uVar9 <= uVar3)) {
              uVar10 = (uint)(ushort)(*(ushort *)(pbVar5 + 2) << 8 | *(ushort *)(pbVar5 + 2) >> 8);
            }
            else {
              uVar9 = uVar17 | 10;
              if (uVar3 < uVar9) {
                uVar9 = 0;
                uVar10 = 0;
              }
              else {
                uVar10 = *(uint *)(pbVar5 + 6);
                uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                         uVar10 << 0x18;
              }
            }
          }
          else {
            uVar9 = uVar17 | 2;
          }
        }
        uVar20 = uVar10 + uVar9;
        if ((uVar20 == 0 || SCARRY4(uVar10,uVar9) != (int)uVar20 < 0) || ((int)uVar3 < (int)uVar20))
        break;
        (conn->mg_conn).content_len = (long)(int)uVar10;
        pbVar19 = pbVar5 + uVar9;
        (conn->mg_conn).content = (char *)pbVar19;
        (conn->mg_conn).wsbits = (uint)*pbVar5;
        if (uVar17 != 0) {
          uVar14 = (ulong)uVar10;
          if ((int)uVar10 < 1) {
            uVar14 = 0;
          }
          for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
            pbVar19[uVar18] = pbVar19[uVar18] ^ pbVar19[(ulong)((uint)uVar18 & 3) - (ulong)uVar17];
          }
        }
        iVar7 = call_user(conn,MG_REQUEST);
        pnVar6 = conn->ns_conn;
        if (iVar7 == 0) {
          puVar1 = &pnVar6->flags;
          *(byte *)puVar1 = (byte)*puVar1 | 1;
        }
        iobuf_remove(&pnVar6->recv_iobuf,(ulong)uVar20);
      }
    }
    eVar8 = conn->endpoint_type;
  }
  if ((eVar8 == EP_PUT) && ((pnVar4->recv_iobuf).len != 0)) {
    pnVar4 = conn->ns_conn;
    sVar13 = (pnVar4->recv_iobuf).len;
    if (conn->cl < (long)sVar13) {
      sVar13 = conn->cl;
    }
    sVar15 = write((conn->endpoint).fd,(pnVar4->recv_iobuf).buf,sVar13);
    if ((int)(uint)sVar15 < 1) {
      lVar16 = conn->cl;
    }
    else {
      uVar14 = (ulong)((uint)sVar15 & 0x7fffffff);
      iobuf_remove(&pnVar4->recv_iobuf,uVar14);
      lVar16 = conn->cl - uVar14;
      conn->cl = lVar16;
    }
    if (lVar16 < 1) {
      close_local_endpoint(conn);
    }
  }
  return;
}

Assistant:

static void on_recv_data(struct connection *conn) {
  struct iobuf *io = &conn->ns_conn->recv_iobuf;
  int n;

  if (conn->endpoint_type == EP_PROXY) {
    if (conn->endpoint.nc != NULL) do_proxy(conn);
    return;
  }

  try_parse(conn);
  DBG(("%p %d %lu %d", conn, conn->request_len, (unsigned long)io->len,
       conn->ns_conn->flags));
  if (conn->request_len < 0 ||
      (conn->request_len > 0 && !is_valid_uri(conn->mg_conn.uri))) {
    send_http_error(conn, 400, NULL);
  } else if (conn->request_len == 0 && io->len > MAX_REQUEST_SIZE) {
    send_http_error(conn, 413, NULL);
  } else if (conn->request_len > 0 &&
             strcmp(conn->mg_conn.http_version, "1.0") != 0 &&
             strcmp(conn->mg_conn.http_version, "1.1") != 0) {
    send_http_error(conn, 505, NULL);
  } else if (conn->request_len > 0 && conn->endpoint_type == EP_NONE) {
#ifndef MONGOOSE_NO_WEBSOCKET
    send_websocket_handshake_if_requested(&conn->mg_conn);
#endif
    send_continue_if_expected(conn);
    open_local_endpoint(conn, 0);
  }

#ifndef MONGOOSE_NO_CGI
  if (conn->endpoint_type == EP_CGI && conn->endpoint.nc != NULL) {
    ns_forward(conn->ns_conn, conn->endpoint.nc);
  }
#endif
  if (conn->endpoint_type == EP_USER) {
    conn->mg_conn.content = io->buf;
    conn->mg_conn.content_len = io->len;
    n = call_user(conn, MG_RECV);
    if (n < 0) {
      conn->ns_conn->flags |= NSF_FINISHED_SENDING_DATA;
    } else if ((size_t) n <= io->len) {
      iobuf_remove(io, n);
    }
    call_request_handler_if_data_is_buffered(conn);
  }
#ifndef MONGOOSE_NO_DAV
  if (conn->endpoint_type == EP_PUT && io->len > 0) {
    forward_put_data(conn);
  }
#endif
}